

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

Pubkey * cfd::core::SchnorrUtil::ComputeSigPointBatch
                   (Pubkey *__return_storage_ptr__,
                   vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *msgs,
                   vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                   *nonces,SchnorrPubkey *pubkey)

{
  initializer_list<cfd::core::Pubkey> __l;
  pointer puVar1;
  SchnorrPubkey *this;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  const_reference pvVar6;
  pointer puVar7;
  const_reference data;
  Privkey *in_stack_fffffffffffffb18;
  Privkey *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb30;
  CfdError in_stack_fffffffffffffb3c;
  CfdException *in_stack_fffffffffffffb40;
  allocator_type *in_stack_fffffffffffffb48;
  undefined8 ****ppppuVar8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *in_stack_fffffffffffffb50;
  undefined8 ****ppppuVar9;
  iterator in_stack_fffffffffffffb58;
  undefined1 *puVar10;
  undefined1 local_441;
  undefined1 ****local_440;
  undefined8 ***local_438 [3];
  undefined1 local_420 [24];
  undefined1 ****local_408;
  undefined8 local_400;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_3f8;
  ByteData local_3e0;
  ByteData256 local_3c8;
  ByteData local_3b0;
  allocator local_391;
  string local_390;
  ByteData local_370;
  ByteData local_358;
  Pubkey local_340;
  undefined1 local_328 [8];
  Pubkey xe;
  Privkey local_2f0;
  ByteData local_2d0;
  ByteData local_2b8;
  ByteData local_2a0;
  ByteData local_288;
  ByteData local_270;
  undefined1 local_258 [8];
  ByteData256 m_tagged_hash;
  size_t i;
  Privkey res;
  string local_210;
  undefined1 local_1f0 [8];
  ByteData bip340_challenge;
  ByteData local_1c0;
  allocator local_1a1;
  string local_1a0;
  ByteData local_180;
  ByteData local_168;
  Pubkey local_150;
  reference local_138;
  SchnorrPubkey *nonce;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *__range3;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pub_nonces;
  allocator local_e1;
  string local_e0;
  ByteData local_c0;
  ByteData local_a8;
  Pubkey local_90;
  undefined1 local_78 [8];
  Pubkey rs;
  allocator local_49;
  string local_48 [32];
  SchnorrPubkey *local_28;
  SchnorrPubkey *pubkey_local;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *nonces_local;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *msgs_local;
  
  local_28 = pubkey;
  pubkey_local = (SchnorrPubkey *)nonces;
  nonces_local = (vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)msgs
  ;
  msgs_local = (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               __return_storage_ptr__;
  sVar3 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)msgs
                    );
  sVar4 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::size
                    ((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
                     pubkey_local);
  if (sVar3 == sVar4) {
    bVar2 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::empty
                      ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       nonces_local);
    if (!bVar2) {
      Pubkey::Pubkey((Pubkey *)local_78);
      sVar3 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         nonces_local);
      if (sVar3 == 1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_e0,"02",&local_e1);
        ByteData::ByteData(&local_c0,&local_e0);
        pvVar6 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                 ::operator[]((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                               *)pubkey_local,0);
        SchnorrPubkey::GetData
                  ((ByteData *)
                   &pub_nonces.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar6);
        ByteData::Concat<cfd::core::ByteData>
                  (&local_a8,&local_c0,
                   (ByteData *)
                   &pub_nonces.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        Pubkey::Pubkey(&local_90,&local_a8);
        Pubkey::operator=((Pubkey *)local_78,&local_90);
        Pubkey::~Pubkey((Pubkey *)0x48efee);
        ByteData::~ByteData((ByteData *)0x48effa);
        ByteData::~ByteData((ByteData *)0x48f006);
        ByteData::~ByteData((ByteData *)0x48f012);
        ::std::__cxx11::string::~string((string *)&local_e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
      else {
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)0x48f0c0);
        this = pubkey_local;
        __end3 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                 ::begin((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                          *)pubkey_local);
        nonce = (SchnorrPubkey *)
                ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::
                end((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
                    this);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<const_cfd::core::SchnorrPubkey_*,_std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>_>
                                      *)&nonce);
          if (!bVar2) break;
          local_138 = __gnu_cxx::
                      __normal_iterator<const_cfd::core::SchnorrPubkey_*,_std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>_>
                      ::operator*(&__end3);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1a0,"02",&local_1a1);
          ByteData::ByteData(&local_180,&local_1a0);
          SchnorrPubkey::GetData(&local_1c0,local_138);
          ByteData::Concat<cfd::core::ByteData>(&local_168,&local_180,&local_1c0);
          Pubkey::Pubkey(&local_150,&local_168);
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                     in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
          Pubkey::~Pubkey((Pubkey *)0x48f1cb);
          ByteData::~ByteData((ByteData *)0x48f1d7);
          ByteData::~ByteData((ByteData *)0x48f1e3);
          ByteData::~ByteData((ByteData *)0x48f1ef);
          ::std::__cxx11::string::~string((string *)&local_1a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          __gnu_cxx::
          __normal_iterator<const_cfd::core::SchnorrPubkey_*,_std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>_>
          ::operator++(&__end3);
        }
        Pubkey::CombinePubkey
                  ((Pubkey *)
                   &bip340_challenge.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range3);
        Pubkey::operator=((Pubkey *)local_78,
                          (Pubkey *)
                          &bip340_challenge.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
        Pubkey::~Pubkey((Pubkey *)0x48f2e8);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   in_stack_fffffffffffffb30);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_210,
                 "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c"
                 ,(allocator *)((long)&res.net_type_ + 3));
      ByteData::ByteData((ByteData *)local_1f0,&local_210);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&res.net_type_ + 3));
      Privkey::Privkey((Privkey *)&i);
      m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        puVar1 = m_tagged_hash.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar7 = (pointer)std::
                          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                          size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                *)nonces_local);
        if (puVar7 <= puVar1) break;
        pvVar6 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                 ::operator[]((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                               *)pubkey_local,
                              (size_type)
                              m_tagged_hash.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        SchnorrPubkey::GetData(&local_2b8,pvVar6);
        ByteData::Concat<cfd::core::ByteData>(&local_2a0,(ByteData *)local_1f0,&local_2b8);
        SchnorrPubkey::GetData(&local_2d0,local_28);
        ByteData::Concat<cfd::core::ByteData>(&local_288,&local_2a0,&local_2d0);
        data = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *
                          )nonces_local,
                          (size_type)
                          m_tagged_hash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        ByteData::Concat<cfd::core::ByteData256>(&local_270,&local_288,data);
        HashUtil::Sha256((ByteData256 *)local_258,&local_270);
        ByteData::~ByteData((ByteData *)0x48f466);
        ByteData::~ByteData((ByteData *)0x48f472);
        ByteData::~ByteData((ByteData *)0x48f47e);
        ByteData::~ByteData((ByteData *)0x48f48a);
        ByteData::~ByteData((ByteData *)0x48f496);
        if (m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
          Privkey::Privkey(&local_2f0,(ByteData256 *)local_258,kMainnet,true);
          Privkey::operator=(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          Privkey::~Privkey((Privkey *)0x48f4df);
        }
        else {
          Privkey::CreateTweakAdd
                    ((Privkey *)
                     &xe.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Privkey *)&i,
                     (ByteData256 *)local_258);
          Privkey::operator=(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          Privkey::~Privkey((Privkey *)0x48f61a);
        }
        ByteData256::~ByteData256((ByteData256 *)0x48f626);
        m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_390,"02",&local_391);
      ByteData::ByteData(&local_370,&local_390);
      SchnorrPubkey::GetData(&local_3b0,local_28);
      ByteData::Concat<cfd::core::ByteData>(&local_358,&local_370,&local_3b0);
      Pubkey::Pubkey(&local_340,&local_358);
      Privkey::GetData(&local_3e0,(Privkey *)&i);
      ByteData256::ByteData256(&local_3c8,&local_3e0);
      Pubkey::CreateTweakMul((Pubkey *)local_328,&local_340,&local_3c8);
      ByteData256::~ByteData256((ByteData256 *)0x48f716);
      ByteData::~ByteData((ByteData *)0x48f722);
      Pubkey::~Pubkey((Pubkey *)0x48f72e);
      ByteData::~ByteData((ByteData *)0x48f73a);
      ByteData::~ByteData((ByteData *)0x48f746);
      ByteData::~ByteData((ByteData *)0x48f752);
      ::std::__cxx11::string::~string((string *)&local_390);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
      local_440 = (undefined1 ****)local_438;
      Pubkey::Pubkey((Pubkey *)in_stack_fffffffffffffb20,(Pubkey *)in_stack_fffffffffffffb18);
      local_440 = (undefined1 ****)local_420;
      Pubkey::Pubkey((Pubkey *)in_stack_fffffffffffffb20,(Pubkey *)in_stack_fffffffffffffb18);
      local_408 = (undefined1 ****)local_438;
      local_400 = 2;
      puVar10 = &local_441;
      ::std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x48f7cb);
      __l._M_len = (size_type)puVar10;
      __l._M_array = in_stack_fffffffffffffb58;
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                (in_stack_fffffffffffffb50,__l,in_stack_fffffffffffffb48);
      Pubkey::CombinePubkey(__return_storage_ptr__,&local_3f8);
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                 in_stack_fffffffffffffb30);
      ::std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x48f81b);
      ppppuVar9 = local_438;
      ppppuVar8 = &local_408;
      do {
        ppppuVar8 = ppppuVar8 + -3;
        Pubkey::~Pubkey((Pubkey *)0x48f84b);
      } while (ppppuVar8 != ppppuVar9);
      Pubkey::~Pubkey((Pubkey *)0x48f871);
      Privkey::~Privkey((Privkey *)0x48f87d);
      ByteData::~ByteData((ByteData *)0x48f889);
      Pubkey::~Pubkey((Pubkey *)0x48f892);
      return __return_storage_ptr__;
    }
  }
  rs.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_48,"Expected same number of messages or nonces, and at least one message.",
             &local_49);
  CfdException::CfdException
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
  rs.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPointBatch(
    const std::vector<ByteData256> &msgs,
    const std::vector<SchnorrPubkey> &nonces, const SchnorrPubkey &pubkey) {
  if (msgs.size() != nonces.size() || msgs.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Expected same number of messages or nonces, and at least one "
        "message.");
  }

  Pubkey rs;

  if (msgs.size() == 1) {
    rs = Pubkey(ByteData("02").Concat(nonces[0].GetData()));
  } else {
    std::vector<Pubkey> pub_nonces;
    for (const auto &nonce : nonces) {
      pub_nonces.push_back(Pubkey(ByteData("02").Concat(nonce.GetData())));
    }
    rs = Pubkey::CombinePubkey(pub_nonces);
  }

  auto bip340_challenge = ByteData(
      "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7"
      "a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c");
  Privkey res;
  for (size_t i = 0; i < msgs.size(); i++) {
    auto m_tagged_hash =
        HashUtil::Sha256(bip340_challenge.Concat(nonces[i].GetData())
                             .Concat(pubkey.GetData())
                             .Concat(msgs[i]));
    if (i == 0) {
      res = Privkey(m_tagged_hash);
    } else {
      res = res.CreateTweakAdd(m_tagged_hash);
    }
  }

  auto xe = Pubkey(ByteData("02").Concat(pubkey.GetData()))
                .CreateTweakMul(ByteData256(res.GetData()));

  return Pubkey::CombinePubkey({rs, xe});
}